

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

void __thiscall
icu_63::UnifiedCache::_putIfAbsentAndGet
          (UnifiedCache *this,CacheKeyBase *key,SharedObject **value,UErrorCode *status)

{
  UBool UVar1;
  UHashElement *element;
  UErrorCode putError;
  UErrorCode local_2c;
  
  umtx_lock_63(&gCacheMutex);
  element = uhash_find_63(this->fHashtable,key);
  if (element == (UHashElement *)0x0) {
    local_2c = U_ZERO_ERROR;
    _putNew(this,key,*value,*status,&local_2c);
  }
  else {
    UVar1 = _inProgress(this,element);
    if (UVar1 == '\0') {
      _fetch(this,element,value,status);
      goto LAB_002eab91;
    }
    _put(this,element,*value,*status);
  }
  _runEvictionSlice(this);
LAB_002eab91:
  umtx_unlock_63(&gCacheMutex);
  return;
}

Assistant:

void UnifiedCache::_putIfAbsentAndGet(
        const CacheKeyBase &key,
        const SharedObject *&value,
        UErrorCode &status) const {
    Mutex lock(&gCacheMutex);
    const UHashElement *element = uhash_find(fHashtable, &key);
    if (element != NULL && !_inProgress(element)) {
        _fetch(element, value, status);
        return;
    }
    if (element == NULL) {
        UErrorCode putError = U_ZERO_ERROR;
        // best-effort basis only.
        _putNew(key, value, status, putError);
    } else {
        _put(element, value, status);
    }
    // Run an eviction slice. This will run even if we added a master entry
    // which doesn't increase the unused count, but that is still o.k
    _runEvictionSlice();
}